

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall Fl_RGB_Image::Fl_RGB_Image(Fl_RGB_Image *this,Fl_Pixmap *pxm,Fl_Color bg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  char **cdata;
  Fl_Color bg_local;
  Fl_Pixmap *pxm_local;
  Fl_RGB_Image *this_local;
  
  iVar1 = Fl_Image::w(&pxm->super_Fl_Image);
  iVar2 = Fl_Image::h(&pxm->super_Fl_Image);
  Fl_Image::Fl_Image(&this->super_Fl_Image,iVar1,iVar2,4);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_RGB_Image_002ec528;
  this->array = (uchar *)0x0;
  this->alloc_array = 0;
  this->id_ = 0;
  this->mask_ = 0;
  if (pxm != (Fl_Pixmap *)0x0) {
    iVar1 = Fl_Image::w(&pxm->super_Fl_Image);
    if (0 < iVar1) {
      iVar1 = Fl_Image::h(&pxm->super_Fl_Image);
      if (0 < iVar1) {
        iVar1 = Fl_Image::w(&this->super_Fl_Image);
        iVar2 = Fl_Image::h(&this->super_Fl_Image);
        iVar3 = Fl_Image::d(&this->super_Fl_Image);
        puVar4 = (uchar *)operator_new__((long)(iVar1 * iVar2 * iVar3));
        this->array = puVar4;
        this->alloc_array = 1;
        cdata = Fl_Image::data(&pxm->super_Fl_Image);
        fl_convert_pixmap(cdata,this->array,bg);
      }
    }
  }
  Fl_Image::data(&this->super_Fl_Image,(char **)&this->array,1);
  return;
}

Assistant:

Fl_RGB_Image::Fl_RGB_Image(const Fl_Pixmap *pxm, Fl_Color bg):
  Fl_Image(pxm->w(), pxm->h(), 4),
  array(0),
  alloc_array(0),
  id_(0),
  mask_(0)
{
  if (pxm && pxm->w() > 0 && pxm->h() > 0) {
    array = new uchar[w() * h() * d()];
    alloc_array = 1;
    fl_convert_pixmap(pxm->data(), (uchar*)array, bg);
  }
  data((const char **)&array, 1);
}